

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O3

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL> *
RankUnserialize(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                *__return_storage_ptr__,string *serialized)

{
  long lVar1;
  long lVar2;
  long *local_50 [2];
  long local_40 [2];
  
  lVar1 = 0x10;
  do {
    *(long *)((long)__return_storage_ptr__->_M_elems + lVar1 + -0x10) =
         (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar1 + -8) = 0;
    *(undefined1 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x130);
  if ((serialized->_M_string_length != 0) &&
     ((serialized->_M_dataplus)._M_p[serialized->_M_string_length - 1] != ',')) {
    std::__cxx11::string::push_back((char)serialized);
  }
  lVar1 = 0;
  do {
    lVar2 = std::__cxx11::string::find((char)serialized,0x2c);
    if (lVar2 == -1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)serialized);
    std::__cxx11::string::operator=
              ((string *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar1),
               (string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x120);
  return __return_storage_ptr__;
}

Assistant:

std::array<std::string, 9> RankUnserialize(std::string serialized)
{
	std::array<std::string, 9> list;
	std::size_t p = 0;
	std::size_t lastp = std::numeric_limits<std::size_t>::max();
	int i = 0;

	if (!serialized.empty() && *(serialized.end()-1) != ',')
	{
		serialized.push_back(',');
	}

	while (i < 9 && (p = serialized.find_first_of(',', lastp+1)) != std::string::npos)
	{
		list[i++] = serialized.substr(lastp+1, p-lastp-1);
		lastp = p;
	}

	return list;
}